

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

void __thiscall Highs::forceHighsSolutionBasisSize(Highs *this)

{
  size_type sVar1;
  
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->solution_).col_value,(long)(this->model_).lp_.num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->solution_).row_value,(long)(this->model_).lp_.num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->solution_).col_dual,(long)(this->model_).lp_.num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->solution_).row_dual,(long)(this->model_).lp_.num_row_);
  sVar1 = (size_type)(this->model_).lp_.num_col_;
  if ((long)(this->basis_).col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->basis_).col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start != sVar1) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&(this->basis_).col_status,sVar1);
    (this->basis_).valid = false;
    (this->basis_).useful = false;
  }
  sVar1 = (size_type)(this->model_).lp_.num_row_;
  if ((long)(this->basis_).row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->basis_).row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start != sVar1) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&(this->basis_).row_status,sVar1);
    (this->basis_).valid = false;
    (this->basis_).useful = false;
  }
  return;
}

Assistant:

void Highs::forceHighsSolutionBasisSize() {
  // Ensure that the HiGHS solution vectors are the right size
  solution_.col_value.resize(model_.lp_.num_col_);
  solution_.row_value.resize(model_.lp_.num_row_);
  solution_.col_dual.resize(model_.lp_.num_col_);
  solution_.row_dual.resize(model_.lp_.num_row_);
  // Ensure that the HiGHS basis vectors are the right size,
  // invalidating the basis if they aren't
  if (basis_.col_status.size() != static_cast<size_t>(model_.lp_.num_col_)) {
    basis_.col_status.resize(model_.lp_.num_col_);
    basis_.valid = false;
    basis_.useful = false;
  }
  if (basis_.row_status.size() != static_cast<size_t>(model_.lp_.num_row_)) {
    basis_.row_status.resize(model_.lp_.num_row_);
    basis_.valid = false;
    basis_.useful = false;
  }
}